

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeExpression(ExpressionContext *ctx,SynBase *syntax)

{
  IntrusiveList<MatchData> matches;
  ExprBase *syntax_00;
  SynBase *ctx_00;
  TypeBase *pTVar1;
  IntrusiveList<MatchData> local_30;
  ExprError *local_20;
  ExprBase *result;
  SynBase *syntax_local;
  ExpressionContext *ctx_local;
  
  ctx->expressionDepth = ctx->expressionDepth + 1;
  result = (ExprBase *)syntax;
  syntax_local = (SynBase *)ctx;
  if (0x800 < ctx->expressionDepth) {
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,syntax,"ERROR: reached maximum generic expression depth (%d)",0x800);
  }
  ctx_00 = syntax_local;
  syntax_00 = result;
  local_20 = (ExprError *)0x0;
  switch(result->typeID) {
  case 0:
    local_20 = (ExprError *)AnalyzeError((ExpressionContext *)syntax_local,(SynError *)result);
    break;
  default:
    break;
  case 4:
    local_20 = (ExprError *)
               AnalyzeVariableAccess((ExpressionContext *)syntax_local,(SynIdentifier *)result);
    break;
  case 5:
    pTVar1 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->super_TypeBase;
    local_20 = anon_unknown.dwarf_6f1cc::ReportExpected
                         ((ExpressionContext *)ctx_00,(SynBase *)syntax_00,pTVar1,
                          "ERROR: cannot take typeid from auto type");
    break;
  case 6:
    anon_unknown.dwarf_6f1cc::Stop
              ((ExpressionContext *)syntax_local,(SynBase *)result,
               "ERROR: cannot take typeid from generic type");
    break;
  case 7:
    local_20 = (ExprError *)
               AnalyzeTypeSimple((ExpressionContext *)syntax_local,(SynTypeSimple *)result);
    break;
  case 8:
    pTVar1 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->super_TypeBase;
    local_20 = anon_unknown.dwarf_6f1cc::ReportExpected
                         ((ExpressionContext *)ctx_00,(SynBase *)syntax_00,pTVar1,
                          "ERROR: cannot take typeid from generic type");
    break;
  case 9:
    local_20 = (ExprError *)
               AnalyzeTypeArray((ExpressionContext *)syntax_local,(SynTypeArray *)result);
    break;
  case 10:
    local_20 = (ExprError *)
               AnalyzeTypeReference((ExpressionContext *)syntax_local,(SynTypeReference *)result);
    break;
  case 0xb:
    local_20 = (ExprError *)
               AnalyzeTypeFunction((ExpressionContext *)syntax_local,(SynTypeFunction *)result);
    break;
  case 0xc:
    local_20 = (ExprError *)
               AnalyzeTypeGenericInstance
                         ((ExpressionContext *)syntax_local,(SynTypeGenericInstance *)result);
    break;
  case 0xd:
    local_20 = (ExprError *)AnalyzeTypeof((ExpressionContext *)syntax_local,(SynTypeof *)result);
    break;
  case 0xe:
    local_20 = (ExprError *)AnalyzeBool((ExpressionContext *)syntax_local,(SynBool *)result);
    break;
  case 0xf:
    local_20 = (ExprError *)AnalyzeNumber((ExpressionContext *)syntax_local,(SynNumber *)result);
    break;
  case 0x10:
    local_20 = (ExprError *)AnalyzeNullptr((ExpressionContext *)syntax_local,(SynNullptr *)result);
    break;
  case 0x11:
    local_20 = (ExprError *)
               AnalyzeCharacter((ExpressionContext *)syntax_local,(SynCharacter *)result);
    break;
  case 0x12:
    local_20 = (ExprError *)AnalyzeString((ExpressionContext *)syntax_local,(SynString *)result);
    break;
  case 0x13:
    local_20 = (ExprError *)AnalyzeArray((ExpressionContext *)syntax_local,(SynArray *)result);
    break;
  case 0x14:
    local_20 = (ExprError *)
               AnalyzeGenerator((ExpressionContext *)syntax_local,(SynGenerator *)result);
    break;
  case 0x17:
    local_20 = (ExprError *)
               AnalyzeMemberAccess((ExpressionContext *)syntax_local,(SynMemberAccess *)result);
    break;
  case 0x19:
    local_20 = (ExprError *)
               AnalyzeArrayIndex((ExpressionContext *)syntax_local,(SynArrayIndex *)result);
    break;
  case 0x1a:
    local_20 = (ExprError *)
               AnalyzeFunctionCall((ExpressionContext *)syntax_local,(SynFunctionCall *)result);
    break;
  case 0x1b:
    local_20 = (ExprError *)
               AnalyzePreModify((ExpressionContext *)syntax_local,(SynPreModify *)result);
    break;
  case 0x1c:
    local_20 = (ExprError *)
               AnalyzePostModify((ExpressionContext *)syntax_local,(SynPostModify *)result);
    break;
  case 0x1d:
    local_20 = (ExprError *)
               AnalyzeGetAddress((ExpressionContext *)syntax_local,(SynGetAddress *)result);
    break;
  case 0x1e:
    local_20 = (ExprError *)
               AnalyzeDereference((ExpressionContext *)syntax_local,(SynDereference *)result);
    break;
  case 0x1f:
    local_20 = (ExprError *)AnalyzeSizeof((ExpressionContext *)syntax_local,(SynSizeof *)result);
    break;
  case 0x20:
    local_20 = (ExprError *)AnalyzeNew((ExpressionContext *)syntax_local,(SynNew *)result);
    break;
  case 0x21:
    local_20 = (ExprError *)
               AnalyzeConditional((ExpressionContext *)syntax_local,(SynConditional *)result);
    break;
  case 0x2f:
    local_20 = (ExprError *)AnalyzeUnaryOp((ExpressionContext *)syntax_local,(SynUnaryOp *)result);
    break;
  case 0x30:
    local_20 = (ExprError *)AnalyzeBinaryOp((ExpressionContext *)syntax_local,(SynBinaryOp *)result)
    ;
    break;
  case 0x31:
    local_20 = (ExprError *)
               AnalyzeAssignment((ExpressionContext *)syntax_local,(SynAssignment *)result);
    break;
  case 0x32:
    local_20 = (ExprError *)
               AnalyzeModifyAssignment
                         ((ExpressionContext *)syntax_local,(SynModifyAssignment *)result);
    break;
  case 0x37:
    IntrusiveList<MatchData>::IntrusiveList(&local_30);
    matches.tail = local_30.tail;
    matches.head = local_30.head;
    local_20 = (ExprError *)
               AnalyzeFunctionDefinition
                         ((ExpressionContext *)ctx_00,(SynFunctionDefinition *)syntax_00,
                          (FunctionData *)0x0,(TypeFunction *)0x0,(TypeBase *)0x0,matches,true,true,
                          true);
    break;
  case 0x39:
    local_20 = (ExprError *)
               AnalyzeShortFunctionDefinition
                         ((ExpressionContext *)syntax_local,(SynShortFunctionDefinition *)result);
  }
  *(int *)&syntax_local[0x217].pos.begin = *(int *)&syntax_local[0x217].pos.begin + -1;
  if (local_20 == (ExprError *)0x0) {
    anon_unknown.dwarf_6f1cc::Stop
              ((ExpressionContext *)syntax_local,(SynBase *)result,"ERROR: unknown expression type")
    ;
  }
  return &local_20->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeExpression(ExpressionContext &ctx, SynBase *syntax)
{
	ctx.expressionDepth++;

	if(ctx.expressionDepth > NULLC_MAX_EXPRESSION_DEPTH)
		Stop(ctx, syntax, "ERROR: reached maximum generic expression depth (%d)", NULLC_MAX_EXPRESSION_DEPTH);

	ExprBase *result = NULL;

	switch(syntax->typeID)
	{
	case SynBool::myTypeID:
		result = AnalyzeBool(ctx, (SynBool*)syntax);
		break;
	case SynCharacter::myTypeID:
		result = AnalyzeCharacter(ctx, (SynCharacter*)syntax);
		break;
	case SynString::myTypeID:
		result = AnalyzeString(ctx, (SynString*)syntax);
		break;
	case SynNullptr::myTypeID:
		result = AnalyzeNullptr(ctx, (SynNullptr*)syntax);
		break;
	case SynNumber::myTypeID:
		result = AnalyzeNumber(ctx, (SynNumber*)syntax);
		break;
	case SynArray::myTypeID:
		result = AnalyzeArray(ctx, (SynArray*)syntax);
		break;
	case SynPreModify::myTypeID:
		result = AnalyzePreModify(ctx, (SynPreModify*)syntax);
		break;
	case SynPostModify::myTypeID:
		result = AnalyzePostModify(ctx, (SynPostModify*)syntax);
		break;
	case SynUnaryOp::myTypeID:
		result = AnalyzeUnaryOp(ctx, (SynUnaryOp*)syntax);
		break;
	case SynBinaryOp::myTypeID:
		result = AnalyzeBinaryOp(ctx, (SynBinaryOp*)syntax);
		break;
	case SynGetAddress::myTypeID:
		result = AnalyzeGetAddress(ctx, (SynGetAddress*)syntax);
		break;
	case SynDereference::myTypeID:
		result = AnalyzeDereference(ctx, (SynDereference*)syntax);
		break;
	case SynTypeof::myTypeID:
		result = AnalyzeTypeof(ctx, (SynTypeof*)syntax);
		break;
	case SynIdentifier::myTypeID:
		result = AnalyzeVariableAccess(ctx, (SynIdentifier*)syntax);
		break;
	case SynTypeSimple::myTypeID:
		result = AnalyzeTypeSimple(ctx, (SynTypeSimple*)syntax);
		break;
	case SynSizeof::myTypeID:
		result = AnalyzeSizeof(ctx, (SynSizeof*)syntax);
		break;
	case SynConditional::myTypeID:
		result = AnalyzeConditional(ctx, (SynConditional*)syntax);
		break;
	case SynAssignment::myTypeID:
		result = AnalyzeAssignment(ctx, (SynAssignment*)syntax);
		break;
	case SynModifyAssignment::myTypeID:
		result = AnalyzeModifyAssignment(ctx, (SynModifyAssignment*)syntax);
		break;
	case SynMemberAccess::myTypeID:
		result = AnalyzeMemberAccess(ctx, (SynMemberAccess*)syntax);
		break;
	case SynTypeArray::myTypeID:
		result = AnalyzeTypeArray(ctx, (SynTypeArray*)syntax);
		break;
	case SynArrayIndex::myTypeID:
		result = AnalyzeArrayIndex(ctx, (SynArrayIndex*)syntax);
		break;
	case SynFunctionCall::myTypeID:
		result = AnalyzeFunctionCall(ctx, (SynFunctionCall*)syntax);
		break;
	case SynNew::myTypeID:
		result = AnalyzeNew(ctx, (SynNew*)syntax);
		break;
	case SynFunctionDefinition::myTypeID:
		result = AnalyzeFunctionDefinition(ctx, (SynFunctionDefinition*)syntax, NULL, NULL, NULL, IntrusiveList<MatchData>(), true, true, true);
		break;
	case SynGenerator::myTypeID:
		result = AnalyzeGenerator(ctx, (SynGenerator*)syntax);
		break;
	case SynTypeReference::myTypeID:
		result = AnalyzeTypeReference(ctx, (SynTypeReference*)syntax);
		break;
	case SynTypeFunction::myTypeID:
		result = AnalyzeTypeFunction(ctx, (SynTypeFunction*)syntax);
		break;
	case SynTypeGenericInstance::myTypeID:
		result = AnalyzeTypeGenericInstance(ctx, (SynTypeGenericInstance*)syntax);
		break;
	case SynShortFunctionDefinition::myTypeID:
		result = AnalyzeShortFunctionDefinition(ctx, (SynShortFunctionDefinition*)syntax);
		break;
	case SynTypeAuto::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from auto type");
		break;
	case SynTypeAlias::myTypeID:
		result = ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot take typeid from generic type");
		break;
	case SynTypeGeneric::myTypeID:
		Stop(ctx, syntax, "ERROR: cannot take typeid from generic type");

		break;
	case SynError::myTypeID:
		result = AnalyzeError(ctx, (SynError*)syntax);
		break;
	default:
		break;
	}

	ctx.expressionDepth--;

	if(!result)
		Stop(ctx, syntax, "ERROR: unknown expression type");

	return result;
}